

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O3

Vec3<float> Imath_3_2::closestPointOnBox<float>(Vec3<float> *p,Box<Imath_3_2::Vec3<float>_> *box)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec3<float> *q_1;
  int i;
  long lVar6;
  Vec3<float> *q;
  float *in_RDI;
  float in_XMM1_Da;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vec3<float> VVar16;
  Vec3<float> VVar17;
  Vec3<float> VVar18;
  Vec3<float> VVar19;
  
  fVar1 = (box->min).x;
  fVar2 = (box->max).x;
  if (fVar1 <= fVar2) {
    in_XMM1_Da = (box->min).y;
    fVar3 = (box->max).y;
    if (in_XMM1_Da <= fVar3) {
      fVar4 = (box->min).z;
      fVar5 = (box->max).z;
      if (fVar4 <= fVar5) {
        lVar6 = 0;
        do {
          fVar7 = (&p->x)[lVar6];
          fVar8 = (&(box->min).x)[lVar6];
          if ((fVar7 < fVar8) || (fVar8 = (&(box->max).x)[lVar6], fVar8 < fVar7)) {
            in_RDI[lVar6] = fVar8;
          }
          else {
            in_RDI[lVar6] = fVar7;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        fVar7 = p->x;
        if ((*in_RDI == fVar7) && (!NAN(*in_RDI) && !NAN(fVar7))) {
          fVar8 = p->y;
          if ((in_RDI[1] == fVar8) && (!NAN(in_RDI[1]) && !NAN(fVar8))) {
            fVar9 = p->z;
            if ((in_RDI[2] == fVar9) && (!NAN(in_RDI[2]) && !NAN(fVar9))) {
              fVar10 = fVar2 - fVar7;
              fVar7 = fVar7 - fVar1;
              fVar11 = fVar3 - fVar8;
              fVar8 = fVar8 - in_XMM1_Da;
              fVar12 = fVar5 - fVar9;
              fVar9 = fVar9 - fVar4;
              fVar15 = fVar7;
              if (fVar10 <= fVar7) {
                fVar15 = fVar10;
              }
              fVar13 = fVar8;
              if (fVar11 <= fVar8) {
                fVar13 = fVar11;
              }
              fVar14 = fVar9;
              if (fVar12 <= fVar9) {
                fVar14 = fVar12;
              }
              if ((fVar15 < fVar13) && (fVar15 < fVar14)) {
                VVar17.x = (uint)fVar1 & -(uint)(fVar7 < fVar10);
                *in_RDI = (float)(~-(uint)(fVar7 < fVar10) & (uint)fVar2 | VVar17.x);
                VVar17.y = 0.0;
                VVar17.z = in_XMM1_Da;
                return VVar17;
              }
              if (fVar13 < fVar14) {
                VVar18.z = (float)((uint)in_XMM1_Da & -(uint)(fVar8 < fVar11));
                in_RDI[1] = (float)(~-(uint)(fVar8 < fVar11) & (uint)fVar3 | (uint)VVar18.z);
                VVar18.y = 0.0;
                VVar18.x = fVar1;
                return VVar18;
              }
              in_RDI[2] = (float)(~-(uint)(fVar9 < fVar12) & (uint)fVar5 |
                                 (uint)fVar4 & -(uint)(fVar9 < fVar12));
            }
          }
        }
        VVar19.y = 0.0;
        VVar19.x = fVar1;
        VVar19.z = in_XMM1_Da;
        return VVar19;
      }
    }
  }
  fVar1 = p->y;
  in_RDI[0] = p->x;
  in_RDI[1] = fVar1;
  fVar1 = p->z;
  in_RDI[2] = fVar1;
  VVar16.y = 0.0;
  VVar16.x = fVar1;
  VVar16.z = in_XMM1_Da;
  return VVar16;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Vec3<T>
closestPointOnBox (const Vec3<T>& p, const Box<Vec3<T>>& box) IMATH_NOEXCEPT
{
    if (box.isEmpty ()) return p;

    Vec3<T> q = closestPointInBox (p, box);

    if (q == p)
    {
        Vec3<T> d1 = p - box.min;
        Vec3<T> d2 = box.max - p;

        Vec3<T> d (
            (d1.x < d2.x) ? d1.x : d2.x,
            (d1.y < d2.y) ? d1.y : d2.y,
            (d1.z < d2.z) ? d1.z : d2.z);

        if (d.x < d.y && d.x < d.z)
        {
            q.x = (d1.x < d2.x) ? box.min.x : box.max.x;
        }
        else if (d.y < d.z)
        {
            q.y = (d1.y < d2.y) ? box.min.y : box.max.y;
        }
        else
        {
            q.z = (d1.z < d2.z) ? box.min.z : box.max.z;
        }
    }

    return q;
}